

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void prvTidyDeclareUserTag(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  TidyOptionId TVar1;
  ulong uVar2;
  UserTagType tagType;
  
  TVar1 = opt->id;
  if ((int)TVar1 < 0x15) {
    if (TVar1 == TidyBlockTags) {
      tagType = tagtype_block;
    }
    else {
      if ((TVar1 != TidyCustomTags) || (uVar2 = (doc->config).value[0x56].v, 3 < uVar2 - 1)) {
LAB_0014402a:
        prvTidyReportUnknownOption(doc,opt->name);
        return;
      }
      tagType = *(UserTagType *)("wbr" + uVar2 * 4);
    }
  }
  else if (TVar1 == TidyEmptyTags) {
    tagType = tagtype_empty;
  }
  else {
    tagType = tagtype_inline;
    if (TVar1 != TidyInlineTags) {
      if (TVar1 != TidyPreTags) goto LAB_0014402a;
      tagType = tagtype_pre;
    }
  }
  prvTidyDefineTag(doc,tagType,name);
  return;
}

Assistant:

void TY_(DeclareUserTag)( TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name )
{
    UserTagType tagType;

    switch ( opt->id )
    {
        case TidyInlineTags:  tagType = tagtype_inline;              break;
        case TidyBlockTags:   tagType = tagtype_block;               break;
        case TidyEmptyTags:   tagType = tagtype_empty;               break;
        case TidyPreTags:     tagType = tagtype_pre;                 break;
        case TidyCustomTags:
        {
            switch (cfg( doc, TidyUseCustomTags ))
            {
                case TidyCustomBlocklevel: tagType = tagtype_block;  break;
                case TidyCustomEmpty:      tagType = tagtype_empty;  break;
                case TidyCustomInline:     tagType = tagtype_inline; break;
                case TidyCustomPre:        tagType = tagtype_pre;    break;
                default: TY_(ReportUnknownOption)( doc, opt->name ); return;
            }
        } break;
        default:
        TY_(ReportUnknownOption)( doc, opt->name );
        return;
    }

    TY_(DefineTag)( doc, tagType, name );
}